

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O3

int selections_handles_lt_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  int iVar2;
  int top;
  int left;
  Am_Object sel_group;
  Am_Object for_obj;
  int local_38;
  int local_34;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  local_28.data = (Am_Object_Data *)0x0;
  local_30.data = (Am_Object_Data *)0x0;
  in_value = Am_Object::Get(self,0xa3,0);
  Am_Object::operator=(&local_28,in_value);
  Am_Object::Get_Object(&local_18,(Am_Slot_Key)self,10);
  Am_Object::operator=(&local_30,&local_18);
  Am_Object::~Am_Object(&local_18);
  Am_Object::Am_Object(&local_20,&local_28);
  bVar1 = Am_Object_And_Owners_Valid_And_Visible(&local_20);
  Am_Object::~Am_Object(&local_20);
  if (bVar1) {
    local_34 = -7;
    local_38 = -7;
    bVar1 = Am_Object::Valid(&local_30);
    iVar2 = -7;
    if (bVar1) {
      Am_Translate_Coordinates(&local_28,-7,-7,&local_30,&local_34,&local_38);
      iVar2 = local_38;
    }
  }
  else {
    iVar2 = 0;
    local_34 = 0;
    local_38 = 0;
  }
  Am_Object::Set(self,0x65,iVar2,0);
  iVar2 = local_34;
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_28);
  return iVar2;
}

Assistant:

Am_Define_Formula(int, selections_handles_lt)
{
  Am_Object for_obj, sel_group;
  int left, top;
  for_obj = self.Get(Am_ITEM);
  sel_group = self.Get_Owner();
  if (Am_Object_And_Owners_Valid_And_Visible(for_obj)) {
    left = -HANDLE_SIZE_D2;
    top = -HANDLE_SIZE_D2;
    if (sel_group.Valid())
      Am_Translate_Coordinates(for_obj, left, top, sel_group, left, top);
    /* ****
    if (for_obj.Is_Instance_Of (Am_Line)) {
      int x1, x2, obj_left, y1, y2, obj_top;
      x1 = for_obj.GV (Am_X1);
      x2 = for_obj.GV (Am_X2);
      obj_left = for_obj.Get (Am_LEFT);
      if (x1 < x2)
        left += x1 - obj_left;
      else
        left += x2 - obj_left;
      y1 = for_obj.GV (Am_Y1);
      y2 = for_obj.GV (Am_Y2);
      obj_top = for_obj.Get (Am_TOP);
      if (y1 < y2)
        top += y1 - obj_top;
      else
        top += y2 - obj_top;
    }
    //std::cout << "<>For " << self << " calculating l,t (" << left << ","
    //	  << top << ") for_obj "
    //	  << for_obj << " owner " << owner
    //	  << std::endl <<std::flush;
    *****  */
  } else {
    left = 0;
    top = 0;
  }
  self.Set(Am_TOP, top);
  return (left);
}